

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisig_tests.cpp
# Opt level: O0

void __thiscall multisig_tests::multisig_verify::test_method(multisig_verify *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  span<const_unsigned_char,_18446744073709551615UL> b_05;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  long in_FS_OFFSET;
  CTransaction *in_stack_ffffffffffffeb18;
  undefined7 in_stack_ffffffffffffeb20;
  undefined1 in_stack_ffffffffffffeb27;
  undefined4 in_stack_ffffffffffffeb28;
  uint in_stack_ffffffffffffeb2c;
  CMutableTransaction *in_stack_ffffffffffffeb30;
  CMutableTransaction *in_stack_ffffffffffffeb38;
  CKey *in_stack_ffffffffffffeb40;
  undefined4 in_stack_ffffffffffffeb48;
  opcodetype in_stack_ffffffffffffeb4c;
  CMutableTransaction *in_stack_ffffffffffffeb50;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffeb58;
  CKey *local_1498;
  undefined8 in_stack_ffffffffffffeb78;
  CMutableTransaction *pCVar4;
  CTransaction *in_stack_ffffffffffffeb80;
  CMutableTransaction *pCVar5;
  undefined7 in_stack_ffffffffffffeb88;
  undefined1 in_stack_ffffffffffffeb8f;
  lazy_ostream *in_stack_ffffffffffffeb90;
  undefined7 in_stack_ffffffffffffebc0;
  undefined1 in_stack_ffffffffffffebc7;
  lazy_ostream *in_stack_ffffffffffffebc8;
  undefined8 in_stack_ffffffffffffebd0;
  undefined7 in_stack_ffffffffffffebd8;
  undefined1 in_stack_ffffffffffffebdf;
  lazy_ostream *in_stack_ffffffffffffebe0;
  undefined4 in_stack_ffffffffffffebe8;
  uint in_stack_ffffffffffffebec;
  lazy_ostream *in_stack_ffffffffffffece8;
  CMutableTransaction *local_1278;
  CKey *local_11e0;
  int i_1;
  int i;
  uint flags;
  multisig_verify *this_local;
  const_string local_11b8;
  lazy_ostream local_11a8 [2];
  assertion_result local_1188 [2];
  const_string local_1150;
  lazy_ostream local_1140 [4];
  assertion_result local_10f8 [2];
  const_string local_10c0;
  lazy_ostream local_10b0 [2];
  assertion_result local_1090 [2];
  const_string local_1058;
  lazy_ostream local_1048 [4];
  assertion_result local_1000 [2];
  int j;
  int i_4;
  const_string local_fc0;
  lazy_ostream local_fb0 [2];
  assertion_result local_f90 [2];
  const_string local_f58 [2];
  lazy_ostream local_f38 [4];
  assertion_result local_ef0 [2];
  const_string local_eb8;
  lazy_ostream local_ea8 [2];
  assertion_result local_e88 [2];
  const_string local_e50;
  lazy_ostream local_e40 [4];
  assertion_result local_df8 [2];
  const_string local_dc0;
  lazy_ostream local_db0 [2];
  assertion_result local_d90 [2];
  const_string local_d58;
  lazy_ostream local_d48 [4];
  assertion_result local_d00 [2];
  int i_3;
  const_string local_cc0;
  lazy_ostream local_cb0 [2];
  assertion_result local_c90 [2];
  const_string local_c58;
  lazy_ostream local_c48 [4];
  assertion_result local_c00 [2];
  const_string local_bc8;
  lazy_ostream local_bb8 [2];
  assertion_result local_b98 [2];
  const_string local_b60;
  lazy_ostream local_b50 [4];
  assertion_result local_b08 [2];
  int i_2;
  const_string local_ac8;
  lazy_ostream local_ab8 [2];
  assertion_result local_a98 [2];
  const_string local_a60 [2];
  lazy_ostream local_a40 [4];
  assertion_result local_9f8 [2];
  vector<CKey,_std::allocator<CKey>_> keys;
  CMutableTransaction txFrom;
  CAmount amount;
  ScriptError err;
  CScript s;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  CMutableTransaction txTo [3];
  CMutableTransaction aCStack_280 [3];
  CScript escrow;
  CScript a_or_b;
  CScript a_and_b;
  CKey key [4];
  long local_8;
  
  local_1000[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1000[0]._1_7_ = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  flags = 3;
  local_11e0 = key;
  do {
    CKey::CKey((CKey *)in_stack_ffffffffffffeb18);
    local_11e0 = local_11e0 + 1;
  } while (local_11e0 != (CKey *)&stack0xfffffffffffffff8);
  for (i = 0; i < 4; i = i + 1) {
    CKey::MakeNewKey((CKey *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (bool)in_stack_ffffffffffffeb27);
  }
  CScript::CScript((CScript *)in_stack_ffffffffffffeb18);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  CKey::GetPubKey(in_stack_ffffffffffffeb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffeb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  b._M_extent._M_extent_value = in_stack_ffffffffffffeb58._M_extent_value;
  b._M_ptr = (pointer)in_stack_ffffffffffffeb50;
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb38,b);
  CKey::GetPubKey(in_stack_ffffffffffffeb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffeb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  b_00._M_extent._M_extent_value = in_stack_ffffffffffffeb58._M_extent_value;
  b_00._M_ptr = (pointer)in_stack_ffffffffffffeb50;
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb38,b_00);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  CScript::CScript((CScript *)in_stack_ffffffffffffeb18);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  CKey::GetPubKey(in_stack_ffffffffffffeb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffeb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  b_01._M_extent._M_extent_value = in_stack_ffffffffffffeb58._M_extent_value;
  b_01._M_ptr = (pointer)in_stack_ffffffffffffeb50;
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb38,b_01);
  CKey::GetPubKey(in_stack_ffffffffffffeb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffeb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  b_02._M_extent._M_extent_value = in_stack_ffffffffffffeb58._M_extent_value;
  b_02._M_ptr = (pointer)in_stack_ffffffffffffeb50;
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb38,b_02);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  CScript::CScript((CScript *)in_stack_ffffffffffffeb18);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  CKey::GetPubKey(in_stack_ffffffffffffeb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffeb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  b_03._M_extent._M_extent_value = in_stack_ffffffffffffeb58._M_extent_value;
  b_03._M_ptr = (pointer)in_stack_ffffffffffffeb50;
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb38,b_03);
  CKey::GetPubKey(in_stack_ffffffffffffeb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffeb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  b_04._M_extent._M_extent_value = in_stack_ffffffffffffeb58._M_extent_value;
  b_04._M_ptr = (pointer)in_stack_ffffffffffffeb50;
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb38,b_04);
  CKey::GetPubKey(in_stack_ffffffffffffeb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffeb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  b_05._M_extent._M_extent_value = in_stack_ffffffffffffeb58._M_extent_value;
  b_05._M_ptr = (pointer)in_stack_ffffffffffffeb50;
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb38,b_05);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeb18);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeb38,
             (size_type)in_stack_ffffffffffffeb30);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  local_1278 = txTo;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeb18);
    local_1278 = local_1278 + 1;
  } while (local_1278 != aCStack_280);
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              (&in_stack_ffffffffffffeb38->vin,(size_type)in_stack_ffffffffffffeb30);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeb38,
               (size_type)in_stack_ffffffffffffeb30);
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                        CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                        CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
    (pvVar2->prevout).n = i_1;
    CMutableTransaction::GetHash(in_stack_ffffffffffffeb38);
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                        CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                        CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
    *(undefined8 *)(pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_348;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         local_340;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_338;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_330;
    pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                        CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                        CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
    pvVar3->nValue = 1;
  }
  std::vector<CKey,_std::allocator<CKey>_>::vector
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffeb18);
  CScript::CScript((CScript *)in_stack_ffffffffffffeb18);
  std::vector<CKey,_std::allocator<CKey>_>::assign
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
             (value_type *)in_stack_ffffffffffffeb18);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (value_type *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffeb58._M_extent_value,in_stack_ffffffffffffeb50);
  sign_multisig((CScript *)in_stack_ffffffffffffeb90,
                (vector<CKey,_std::allocator<CKey>_> *)
                CONCAT17(in_stack_ffffffffffffeb8f,in_stack_ffffffffffffeb88),
                in_stack_ffffffffffffeb80,(int)((ulong)in_stack_ffffffffffffeb78 >> 0x20));
  CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
  CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
  CTransaction::~CTransaction(in_stack_ffffffffffffeb18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
               (const_string *)in_stack_ffffffffffffeb50,
               CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
               (const_string *)in_stack_ffffffffffffeb40);
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffeb38,
               in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
    VerifyScript((CScript *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                 (CScript *)in_stack_ffffffffffffebe0,
                 (CScriptWitness *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                 (uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                 (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (bool)in_stack_ffffffffffffeb27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9f8,local_a40,local_a60,0x51,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb18);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffeb18)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
               (const_string *)in_stack_ffffffffffffeb50,
               CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
               (const_string *)in_stack_ffffffffffffeb40);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (bool)in_stack_ffffffffffffeb27);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_a98,local_ab8,&local_ac8,0x52,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffeb18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeb18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
    std::vector<CKey,_std::allocator<CKey>_>::assign
              ((vector<CKey,_std::allocator<CKey>_> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (value_type *)in_stack_ffffffffffffeb18);
    CTransaction::CTransaction
              ((CTransaction *)in_stack_ffffffffffffeb58._M_extent_value,in_stack_ffffffffffffeb50);
    sign_multisig((CScript *)in_stack_ffffffffffffeb90,
                  (vector<CKey,_std::allocator<CKey>_> *)
                  CONCAT17(in_stack_ffffffffffffeb8f,in_stack_ffffffffffffeb88),
                  in_stack_ffffffffffffeb80,(int)((ulong)in_stack_ffffffffffffeb78 >> 0x20));
    CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                       (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
    CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
    CTransaction::~CTransaction(in_stack_ffffffffffffeb18);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                 (const_string *)in_stack_ffffffffffffeb50,
                 CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                 (const_string *)in_stack_ffffffffffffeb40);
      GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
                ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                 in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
                 (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
      VerifyScript((CScript *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                   (CScript *)in_stack_ffffffffffffebe0,
                   (CScriptWitness *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                   (uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                   (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                   (ScriptError *)CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (bool)in_stack_ffffffffffffeb27);
      boost::unit_test::lazy_ostream::instance();
      tinyformat::format<int>
                ((char *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                 (int *)in_stack_ffffffffffffeb40);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_b08,local_b50,&local_b60,0x58,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffeb18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeb18);
      GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
                ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                 in_stack_ffffffffffffeb18);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                 (const_string *)in_stack_ffffffffffffeb50,
                 CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                 (const_string *)in_stack_ffffffffffffeb40);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (bool)in_stack_ffffffffffffeb27);
      in_stack_ffffffffffffece8 = boost::unit_test::lazy_ostream::instance();
      ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_b98,local_bb8,&local_bc8,0x59,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffeb18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeb18);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<CKey,_std::allocator<CKey>_>::assign
              ((vector<CKey,_std::allocator<CKey>_> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (value_type *)in_stack_ffffffffffffeb18);
    std::vector<CKey,_std::allocator<CKey>_>::push_back
              ((vector<CKey,_std::allocator<CKey>_> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (value_type *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
    CTransaction::CTransaction
              ((CTransaction *)in_stack_ffffffffffffeb58._M_extent_value,in_stack_ffffffffffffeb50);
    sign_multisig((CScript *)in_stack_ffffffffffffeb90,
                  (vector<CKey,_std::allocator<CKey>_> *)
                  CONCAT17(in_stack_ffffffffffffeb8f,in_stack_ffffffffffffeb88),
                  in_stack_ffffffffffffeb80,(int)((ulong)in_stack_ffffffffffffeb78 >> 0x20));
    CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                       (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
    CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
    CTransaction::~CTransaction(in_stack_ffffffffffffeb18);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                 (const_string *)in_stack_ffffffffffffeb50,
                 CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                 (const_string *)in_stack_ffffffffffffeb40);
      GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
                ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                 in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
                 (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
      VerifyScript((CScript *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                   (CScript *)in_stack_ffffffffffffebe0,
                   (CScriptWitness *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                   (uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                   (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                   (ScriptError *)CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (bool)in_stack_ffffffffffffeb27);
      boost::unit_test::lazy_ostream::instance();
      tinyformat::format<int>
                ((char *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                 (int *)in_stack_ffffffffffffeb40);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_c00,local_c48,&local_c58,0x5e,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffeb18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeb18);
      GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
                ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                 in_stack_ffffffffffffeb18);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                 (const_string *)in_stack_ffffffffffffeb50,
                 CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                 (const_string *)in_stack_ffffffffffffeb40);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (bool)in_stack_ffffffffffffeb27);
      boost::unit_test::lazy_ostream::instance();
      ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (unsigned_long)in_stack_ffffffffffffeb18);
      in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_c90,local_cb0,&local_cc0,0x5f,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffeb18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb18);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeb18);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
    std::vector<CKey,_std::allocator<CKey>_>::assign
              ((vector<CKey,_std::allocator<CKey>_> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (value_type *)in_stack_ffffffffffffeb18);
    CTransaction::CTransaction
              ((CTransaction *)in_stack_ffffffffffffeb58._M_extent_value,in_stack_ffffffffffffeb50);
    sign_multisig((CScript *)in_stack_ffffffffffffeb90,
                  (vector<CKey,_std::allocator<CKey>_> *)
                  CONCAT17(in_stack_ffffffffffffeb8f,in_stack_ffffffffffffeb88),
                  in_stack_ffffffffffffeb80,(int)((ulong)in_stack_ffffffffffffeb78 >> 0x20));
    CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                       (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
    CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
    CTransaction::~CTransaction(in_stack_ffffffffffffeb18);
    if ((i_3 == 0) || (i_3 == 1)) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                   (const_string *)in_stack_ffffffffffffeb50,
                   CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                   (const_string *)in_stack_ffffffffffffeb40);
        GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
                  ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                   in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
                   (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
        VerifyScript((CScript *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                     (CScript *)in_stack_ffffffffffffebe0,
                     (CScriptWitness *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8)
                     ,(uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                     (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                     (ScriptError *)CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28)
                   ,(bool)in_stack_ffffffffffffeb27);
        boost::unit_test::lazy_ostream::instance();
        tinyformat::format<int>
                  ((char *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                   (int *)in_stack_ffffffffffffeb40);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_d00,local_d48,&local_d58,0x69,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffeb18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffeb18);
        GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
                  ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                   in_stack_ffffffffffffeb18);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                   (const_string *)in_stack_ffffffffffffeb50,
                   CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                   (const_string *)in_stack_ffffffffffffeb40);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28)
                   ,(bool)in_stack_ffffffffffffeb27);
        boost::unit_test::lazy_ostream::instance();
        ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_d90,local_db0,&local_dc0,0x6a,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffeb18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffeb18);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                   (const_string *)in_stack_ffffffffffffeb50,
                   CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                   (const_string *)in_stack_ffffffffffffeb40);
        GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
                  ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                   in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
                   (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
        VerifyScript((CScript *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                     (CScript *)in_stack_ffffffffffffebe0,
                     (CScriptWitness *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8)
                     ,(uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                     (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                     (ScriptError *)CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28)
                   ,(bool)in_stack_ffffffffffffeb27);
        boost::unit_test::lazy_ostream::instance();
        tinyformat::format<int>
                  ((char *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                   (int *)in_stack_ffffffffffffeb40);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_df8,local_e40,&local_e50,0x6e,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffeb18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffeb18);
        GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
                  ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                   in_stack_ffffffffffffeb18);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                   (const_string *)in_stack_ffffffffffffeb50,
                   CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                   (const_string *)in_stack_ffffffffffffeb40);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28)
                   ,(bool)in_stack_ffffffffffffeb27);
        boost::unit_test::lazy_ostream::instance();
        ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                   (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                   (unsigned_long)in_stack_ffffffffffffeb18);
        in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_e88,local_ea8,&local_eb8,0x6f,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffeb18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffeb18);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  CScript::clear((CScript *)in_stack_ffffffffffffeb18);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
               (const_string *)in_stack_ffffffffffffeb50,
               CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
               (const_string *)in_stack_ffffffffffffeb40);
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffeb38,
               in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
    VerifyScript((CScript *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                 (CScript *)in_stack_ffffffffffffebe0,
                 (CScriptWitness *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                 (uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                 (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (bool)in_stack_ffffffffffffeb27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ef0,local_f38,local_f58,0x74,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb18);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffeb18)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
               (const_string *)in_stack_ffffffffffffeb50,
               CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
               (const_string *)in_stack_ffffffffffffeb40);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (bool)in_stack_ffffffffffffeb27);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
               (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (unsigned_long)in_stack_ffffffffffffeb18);
    in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_f90,local_fb0,&local_fc0,0x75,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffeb18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeb18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (i_4 = 0; i_4 < 4; i_4 = i_4 + 1) {
    for (j = 0; j < 4; j = j + 1) {
      std::vector<CKey,_std::allocator<CKey>_>::assign
                ((vector<CKey,_std::allocator<CKey>_> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 (value_type *)in_stack_ffffffffffffeb18);
      std::vector<CKey,_std::allocator<CKey>_>::push_back
                ((vector<CKey,_std::allocator<CKey>_> *)
                 CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (value_type *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
      CTransaction::CTransaction
                ((CTransaction *)in_stack_ffffffffffffeb58._M_extent_value,in_stack_ffffffffffffeb50
                );
      sign_multisig((CScript *)in_stack_ffffffffffffeb90,
                    (vector<CKey,_std::allocator<CKey>_> *)
                    CONCAT17(in_stack_ffffffffffffeb8f,in_stack_ffffffffffffeb88),
                    in_stack_ffffffffffffeb80,(int)((ulong)in_stack_ffffffffffffeb78 >> 0x20));
      CScript::operator=((CScript *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                         (CScript *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20));
      CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
      CTransaction::~CTransaction(in_stack_ffffffffffffeb18);
      if (((i_4 < j) && (i_4 < 3)) && (j < 3)) {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                     (const_string *)in_stack_ffffffffffffeb50,
                     CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                     (const_string *)in_stack_ffffffffffffeb40);
          in_stack_ffffffffffffebec = flags;
          GenericTransactionSignatureChecker<CMutableTransaction>::
          GenericTransactionSignatureChecker
                    ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                     in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
                     (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
          bVar1 = VerifyScript((CScript *)
                               CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                               (CScript *)in_stack_ffffffffffffebe0,
                               (CScriptWitness *)
                               CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                               (uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                               (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                               (ScriptError *)
                               CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0));
          in_stack_ffffffffffffebe8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffebe8);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (bool)in_stack_ffffffffffffeb27);
          in_stack_ffffffffffffebe0 = boost::unit_test::lazy_ostream::instance();
          tinyformat::format<int,int>
                    ((char *)in_stack_ffffffffffffeb58._M_extent_value,
                     (int *)in_stack_ffffffffffffeb50,
                     (int *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48));
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_1000,local_1048,&local_1058,0x80,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_ffffffffffffeb18);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffeb18);
          GenericTransactionSignatureChecker<CMutableTransaction>::
          ~GenericTransactionSignatureChecker
                    ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                     in_stack_ffffffffffffeb18);
          in_stack_ffffffffffffebdf = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_ffffffffffffebdf);
        do {
          in_stack_ffffffffffffebd0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                     (const_string *)in_stack_ffffffffffffeb50,
                     CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                     (const_string *)in_stack_ffffffffffffeb40);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (bool)in_stack_ffffffffffffeb27);
          in_stack_ffffffffffffebc8 = boost::unit_test::lazy_ostream::instance();
          ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_1090,local_10b0,&local_10c0,0x81,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_ffffffffffffeb18);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffeb18);
          in_stack_ffffffffffffebc7 = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_ffffffffffffebc7);
      }
      else {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                     (const_string *)in_stack_ffffffffffffeb50,
                     CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                     (const_string *)in_stack_ffffffffffffeb40);
          GenericTransactionSignatureChecker<CMutableTransaction>::
          GenericTransactionSignatureChecker
                    ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                     in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c,
                     (CAmount *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (MissingDataBehavior)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
          VerifyScript((CScript *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                       (CScript *)in_stack_ffffffffffffebe0,
                       (CScriptWitness *)
                       CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                       (uint)((ulong)in_stack_ffffffffffffebd0 >> 0x20),
                       (BaseSignatureChecker *)in_stack_ffffffffffffebc8,
                       (ScriptError *)CONCAT17(in_stack_ffffffffffffebc7,in_stack_ffffffffffffebc0))
          ;
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (bool)in_stack_ffffffffffffeb27);
          boost::unit_test::lazy_ostream::instance();
          tinyformat::format<int,int>
                    ((char *)in_stack_ffffffffffffeb58._M_extent_value,
                     (int *)in_stack_ffffffffffffeb50,
                     (int *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48));
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_10f8,local_1140,&local_1150,0x85,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_ffffffffffffeb18);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffeb18);
          GenericTransactionSignatureChecker<CMutableTransaction>::
          ~GenericTransactionSignatureChecker
                    ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                     in_stack_ffffffffffffeb18);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffeb18);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffeb58._M_extent_value,
                     (const_string *)in_stack_ffffffffffffeb50,
                     CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                     (const_string *)in_stack_ffffffffffffeb40);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (bool)in_stack_ffffffffffffeb27);
          in_stack_ffffffffffffeb90 = boost::unit_test::lazy_ostream::instance();
          ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_ffffffffffffece8 >> 0x20));
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                     (pointer)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                     (unsigned_long)in_stack_ffffffffffffeb18);
          in_stack_ffffffffffffeb18 = (CTransaction *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_1188,local_11a8,&local_11b8,0x86,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_ffffffffffffeb18);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb18);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffeb18);
          in_stack_ffffffffffffeb8f = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_ffffffffffffeb8f);
      }
    }
  }
  CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
  std::vector<CKey,_std::allocator<CKey>_>::~vector
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
  pCVar4 = txTo;
  pCVar5 = aCStack_280;
  do {
    pCVar5 = pCVar5 + -1;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeb18);
  } while (pCVar5 != pCVar4);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeb18);
  CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
  CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
  CScript::~CScript((CScript *)in_stack_ffffffffffffeb18);
  local_1498 = (CKey *)&stack0xfffffffffffffff8;
  do {
    local_1498 = local_1498 + -1;
    CKey::~CKey((CKey *)in_stack_ffffffffffffeb18);
  } while (local_1498 != key);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(multisig_verify)
{
    unsigned int flags = SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_STRICTENC;

    ScriptError err;
    CKey key[4];
    CAmount amount = 0;
    for (int i = 0; i < 4; i++)
        key[i].MakeNewKey(true);

    CScript a_and_b;
    a_and_b << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript a_or_b;
    a_or_b << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript escrow;
    escrow << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    CMutableTransaction txFrom;  // Funding transaction
    txFrom.vout.resize(3);
    txFrom.vout[0].scriptPubKey = a_and_b;
    txFrom.vout[1].scriptPubKey = a_or_b;
    txFrom.vout[2].scriptPubKey = escrow;

    CMutableTransaction txTo[3]; // Spending transaction
    for (int i = 0; i < 3; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }

    std::vector<CKey> keys;
    CScript s;

    // Test a AND b:
    keys.assign(1,key[0]);
    keys.push_back(key[1]);
    s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
    BOOST_CHECK(VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    for (int i = 0; i < 4; i++)
    {
        keys.assign(1,key[i]);
        s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
        BOOST_CHECK_MESSAGE(!VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a&b 1: %d", i));
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_INVALID_STACK_OPERATION, ScriptErrorString(err));

        keys.assign(1,key[1]);
        keys.push_back(key[i]);
        s = sign_multisig(a_and_b, keys, CTransaction(txTo[0]), 0);
        BOOST_CHECK_MESSAGE(!VerifyScript(s, a_and_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[0], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a&b 2: %d", i));
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
    }

    // Test a OR b:
    for (int i = 0; i < 4; i++)
    {
        keys.assign(1,key[i]);
        s = sign_multisig(a_or_b, keys, CTransaction(txTo[1]), 0);
        if (i == 0 || i == 1)
        {
            BOOST_CHECK_MESSAGE(VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a|b: %d", i));
            BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
        }
        else
        {
            BOOST_CHECK_MESSAGE(!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("a|b: %d", i));
            BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
        }
    }
    s.clear();
    s << OP_0 << OP_1;
    BOOST_CHECK(!VerifyScript(s, a_or_b, nullptr, flags, MutableTransactionSignatureChecker(&txTo[1], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_SIG_DER, ScriptErrorString(err));


    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
        {
            keys.assign(1,key[i]);
            keys.push_back(key[j]);
            s = sign_multisig(escrow, keys, CTransaction(txTo[2]), 0);
            if (i < j && i < 3 && j < 3)
            {
                BOOST_CHECK_MESSAGE(VerifyScript(s, escrow, nullptr, flags, MutableTransactionSignatureChecker(&txTo[2], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("escrow 1: %d %d", i, j));
                BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
            }
            else
            {
                BOOST_CHECK_MESSAGE(!VerifyScript(s, escrow, nullptr, flags, MutableTransactionSignatureChecker(&txTo[2], 0, amount, MissingDataBehavior::ASSERT_FAIL), &err), strprintf("escrow 2: %d %d", i, j));
                BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
            }
        }
}